

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O3

stumpless_element * stumpless_new_element(char *name)

{
  _Bool _Var1;
  stumpless_element *__dest;
  config_mutex_t *pcVar2;
  size_t name_length;
  size_t local_20;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    _Var1 = validate_element_name(name,&local_20);
    if ((_Var1) &&
       (__dest = (stumpless_element *)alloc_mem(0x48), __dest != (stumpless_element *)0x0)) {
      clear_error();
      __dest->name_length = local_20;
      memcpy(__dest,name,local_20);
      __dest->name[local_20] = '\0';
      __dest->params = (stumpless_param **)0x0;
      __dest->param_count = 0;
      pcVar2 = thread_safety_new_mutex();
      __dest->mutex = pcVar2;
      if (pcVar2 != (config_mutex_t *)0x0) {
        return __dest;
      }
      free_mem(__dest);
    }
  }
  return (stumpless_element *)0x0;
}

Assistant:

struct stumpless_element *
stumpless_new_element( const char *name ) {
  size_t name_length;
  struct stumpless_element *element;
  struct stumpless_element *result;

  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_element_name( name, &name_length ) ) ) {
    return NULL;
  }

  element = alloc_mem( sizeof( *element ) );
  if( unlikely( !element ) ) {
    return NULL;
  }

  clear_error(  );

  result = unchecked_load_element( element, name, name_length );
  if( !result ) {
    free_mem( element );
  }

  return result;
}